

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall
pybind11::str::str<pybind11::detail::accessor_policies::str_attr>
          (str *this,accessor<pybind11::detail::accessor_policies::str_attr> *a)

{
  object *poVar1;
  handle local_10;
  
  poVar1 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(a);
  local_10.m_ptr = (poVar1->super_handle).m_ptr;
  if (local_10.m_ptr != (PyObject *)0x0) {
    (local_10.m_ptr)->ob_refcnt = (local_10.m_ptr)->ob_refcnt + 1;
  }
  str(this,(object *)&local_10);
  object::~object((object *)&local_10);
  return;
}

Assistant:

str(const char *c, size_t n)
        : object(PyUnicode_FromStringAndSize(c, (ssize_t) n), stolen_t{}) {
        if (!m_ptr) pybind11_fail("Could not allocate string object!");
    }